

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSystemTools.cxx
# Opt level: O2

int testSystemTools(int param_1,char **param_2)

{
  __type _Var1;
  ostream *poVar2;
  string strupper;
  string str;
  string local_30;
  
  std::__cxx11::string::string((string *)&str,"abc",(allocator *)&strupper);
  std::__cxx11::string::string((string *)&strupper,"ABC",(allocator *)&local_30);
  cmsys::SystemTools::UpperCase(&local_30,&str);
  _Var1 = std::operator==(&local_30,&strupper);
  std::__cxx11::string::~string((string *)&local_30);
  if (!_Var1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"cmSystemTools::UpperCase is working");
    std::operator<<(poVar2,"\n");
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Passed: ");
    poVar2 = std::operator<<(poVar2,"cmSystemTools::UpperCase is working");
    std::operator<<(poVar2,"\n");
  }
  std::__cxx11::string::~string((string *)&strupper);
  std::__cxx11::string::~string((string *)&str);
  return (uint)!_Var1;
}

Assistant:

int testSystemTools(int, char*[])
{
  int failed = 0;
  // ----------------------------------------------------------------------
  // Test cmSystemTools::UpperCase
  std::string str = "abc";
  std::string strupper = "ABC";
  if(cmSystemTools::UpperCase(str) == strupper)
    {
    cmPassed("cmSystemTools::UpperCase is working");
    }
  else
    {
    cmFailed("cmSystemTools::UpperCase is working");
    }
  return failed;
}